

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_eval_at
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *xyz,
          REF_DBL *dxyz_dtuv)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_CELL ref_cell;
  REF_DBL shape [27];
  REF_DBL local_128;
  REF_DBL clip [3];
  REF_DBL local_108;
  REF_DBL bary [3];
  REF_INT local_e8 [2];
  REF_INT nodes [27];
  int local_74;
  int local_70;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT i;
  REF_NODE ref_node;
  double dStack_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL displacement [3];
  REF_GEOM ref_geom;
  REF_DBL *dxyz_dtuv_local;
  REF_DBL *xyz_local;
  REF_DBL *params_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_FACELIFT ref_facelift_local;
  
  displacement[2] = (REF_DBL)ref_facelift->grid->geom;
  ref_node._4_4_ = ref_egads_eval_at((REF_GEOM)displacement[2],type,id,params,xyz,dxyz_dtuv);
  if (ref_node._4_4_ == 0) {
    if (type == 0) {
      ref_facelift_local._4_4_ = 0;
    }
    else {
      if (ref_facelift->displacement == (REF_DBL *)0x0) {
        _cell_node = ref_facelift->grid->node;
        _ref_private_macro_code_rss_2 = (REF_CELL)0x0;
        uVar1 = ref_facelift_enclosing(ref_facelift,type,id,params,&local_74,&local_108);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2cb,"ref_facelift_eval_at",(ulong)uVar1,"enclose");
          return uVar1;
        }
        if (local_74 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2d1,"ref_facelift_eval_at","no enclosing found");
          if (type == 1) {
            printf("edgeid %d parms %.15e\n",*params,(ulong)(uint)id);
          }
          if (type == 2) {
            printf("faceid %d parms %.15e %.15e\n",*params,params[1],(ulong)(uint)id);
          }
          return 1;
        }
        if (type == 1) {
          _ref_private_macro_code_rss_2 = ref_facelift->edg_cell;
          uVar1 = ref_node_clip_bary2(&local_108,&local_128);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x2d4,"ref_facelift_eval_at",(ulong)uVar1,"clip edge bary");
            return uVar1;
          }
        }
        if (type == 2) {
          _ref_private_macro_code_rss_2 = ref_facelift->tri_cell;
          uVar1 = ref_node_clip_bary3(&local_108,&local_128);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x2d8,"ref_facelift_eval_at",(ulong)uVar1,"clip face bary");
            return uVar1;
          }
        }
        if (_ref_private_macro_code_rss_2 == (REF_CELL)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2da,"ref_facelift_eval_at","ref_cell NULL, protect dereference");
          return 2;
        }
        uVar1 = ref_cell_shape(_ref_private_macro_code_rss_2->type,&local_128,(REF_DBL *)&ref_cell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2db,"ref_facelift_eval_at",(ulong)uVar1,"shape");
          return uVar1;
        }
        uVar1 = ref_cell_nodes(_ref_private_macro_code_rss_2,local_74,local_e8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2dc,"ref_facelift_eval_at",(ulong)uVar1,"nodes");
          return uVar1;
        }
        for (cell = 0; cell < 3; cell = cell + 1) {
          xyz[cell] = 0.0;
          for (local_70 = 0; local_70 < _ref_private_macro_code_rss_2->node_per;
              local_70 = local_70 + 1) {
            xyz[cell] = shape[(long)local_70 + -1] *
                        _cell_node->real[cell + local_e8[local_70] * 0xf] + xyz[cell];
          }
        }
      }
      else {
        uVar1 = ref_facelift_displacement_at(ref_facelift,type,id,params,&stack0xffffffffffffffa8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x2e7,"ref_facelift_eval_at",(ulong)uVar1,"facelift displacement");
          return uVar1;
        }
        *xyz = dStack_58 + *xyz;
        xyz[1] = displacement[0] + xyz[1];
        xyz[2] = displacement[1] + xyz[2];
      }
      ref_facelift_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x2c2,"ref_facelift_eval_at",(ulong)ref_node._4_4_,"egads eval");
    ref_facelift_local._4_4_ = ref_node._4_4_;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_eval_at(REF_FACELIFT ref_facelift, REF_INT type,
                                        REF_INT id, REF_DBL *params,
                                        REF_DBL *xyz, REF_DBL *dxyz_dtuv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL displacement[3];
  RSS(ref_egads_eval_at(ref_geom, type, id, params, xyz, dxyz_dtuv),
      "egads eval");
  if (REF_GEOM_NODE == type) return REF_SUCCESS;
  if (ref_facelift_direct(ref_facelift)) {
    REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
    REF_INT i, cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL bary[3], clip[3];
    REF_DBL shape[REF_CELL_MAX_NODE_PER];
    REF_CELL ref_cell = NULL;
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    RUB(REF_EMPTY, cell, "no enclosing found", {
      if (REF_GEOM_EDGE == type)
        printf("edgeid %d parms %.15e\n", id, params[0]);
      if (REF_GEOM_FACE == type)
        printf("faceid %d parms %.15e %.15e\n", id, params[0], params[1]);
    });
    if (REF_GEOM_EDGE == type) {
      ref_cell = ref_facelift_edg(ref_facelift);
      RSS(ref_node_clip_bary2(bary, clip), "clip edge bary");
    }
    if (REF_GEOM_FACE == type) {
      ref_cell = ref_facelift_tri(ref_facelift);
      RSS(ref_node_clip_bary3(bary, clip), "clip face bary");
    }
    RNS(ref_cell, "ref_cell NULL, protect dereference");
    RSS(ref_cell_shape(ref_cell_type(ref_cell), clip, shape), "shape");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (i = 0; i < 3; i++) {
      xyz[i] = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        xyz[i] +=
            shape[cell_node] * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }
  } else {
    RSS(ref_facelift_displacement_at(ref_facelift, type, id, params,
                                     displacement),
        "facelift displacement");
    xyz[0] += displacement[0];
    xyz[1] += displacement[1];
    xyz[2] += displacement[2];
  }
  return REF_SUCCESS;
}